

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::rightJustified
          (QString *__return_storage_ptr__,QString *this,qsizetype width,QChar fill,bool truncate)

{
  ulong uVar1;
  char16_t *pcVar2;
  QArrayData *data;
  long lVar3;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar1 = (this->d).size;
  if ((long)uVar1 < width) {
    resize(__return_storage_ptr__,width);
    pcVar2 = (__return_storage_ptr__->d).ptr;
    lVar3 = 0;
    do {
      pcVar2[lVar3] = fill.ucs;
      lVar3 = lVar3 + 1;
    } while (width - uVar1 != lVar3);
    if (uVar1 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        memcpy(pcVar2 + lVar3,(this->d).ptr,uVar1 * 2);
        return __return_storage_ptr__;
      }
      goto LAB_0032bfd6;
    }
  }
  else {
    if (!truncate) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QArrayDataPointer<char16_t>::operator=(&__return_storage_ptr__->d,&this->d);
        return __return_storage_ptr__;
      }
      goto LAB_0032bfd6;
    }
    if ((ulong)width < uVar1) {
      QString(&local_48,(QChar *)(this->d).ptr,width);
    }
    else {
      local_48.d.d = (this->d).d;
      local_48.d.ptr = (this->d).ptr;
      local_48.d.size = uVar1;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    uVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = pcVar2;
    local_48.d.size = uVar1;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0032bfd6:
  __stack_chk_fail();
}

Assistant:

QString QString::rightJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        QChar *uc = (QChar*)result.d.data();
        while (padlen--)
           * uc++ = fill;
        if (len)
          memcpy(static_cast<void *>(uc), static_cast<const void *>(d.data()), sizeof(QChar)*len);
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}